

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int get_request_len(char *s,int buf_len)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  ulong uVar4;
  bool bVar5;
  
  if (0 < buf_len) {
    ppuVar3 = __ctype_b_loc();
    uVar4 = 1;
    do {
      bVar1 = s[uVar4 - 1];
      if ((((bVar1 != 10) && (-1 < (char)bVar1)) && (bVar1 != 0xd)) &&
         (((*ppuVar3)[bVar1] & 0x4000) == 0)) {
        return -1;
      }
      if (bVar1 == 10) {
        iVar2 = (int)uVar4;
        if ((uVar4 < (uint)buf_len) && (s[uVar4] == '\n')) {
          return iVar2 + 1;
        }
        if (((iVar2 + 1 < buf_len) && (s[uVar4] == '\r')) && (s[uVar4 + 1] == '\n')) {
          return iVar2 + 2;
        }
      }
      bVar5 = uVar4 != (uint)buf_len;
      uVar4 = uVar4 + 1;
    } while (bVar5);
  }
  return 0;
}

Assistant:

static int get_request_len(const char *s, int buf_len) {
  const unsigned char *buf = (unsigned char *) s;
  int i;

  for (i = 0; i < buf_len; i++) {
    // Control characters are not allowed but >=128 are.
    // Abort scan as soon as one malformed character is found.
    if (!isprint(buf[i]) && buf[i] != '\r' && buf[i] != '\n' && buf[i] < 128) {
      return -1;
    } else if (buf[i] == '\n' && i + 1 < buf_len && buf[i + 1] == '\n') {
      return i + 2;
    } else if (buf[i] == '\n' && i + 2 < buf_len && buf[i + 1] == '\r' &&
               buf[i + 2] == '\n') {
      return i + 3;
    }
  }

  return 0;
}